

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utils.hpp
# Opt level: O0

vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
* dot<double>(vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
              *__return_storage_ptr__,
             vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
             *matrix1,vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                      *matrix2)

{
  double dVar1;
  double dVar2;
  size_type sVar3;
  reference pvVar4;
  size_type __n;
  reference pvVar5;
  int local_6c;
  int local_68;
  int k;
  int j;
  int i;
  allocator<double> local_49;
  value_type_conflict1 local_48;
  vector<double,_std::allocator<double>_> local_40;
  undefined1 local_21;
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  *local_20;
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  *matrix2_local;
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  *matrix1_local;
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  *resultMatrix;
  
  local_21 = 0;
  local_20 = matrix2;
  matrix2_local = matrix1;
  matrix1_local = __return_storage_ptr__;
  sVar3 = std::
          vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
          ::size(matrix1);
  pvVar4 = std::
           vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
           ::operator[](matrix2,0);
  __n = std::vector<double,_std::allocator<double>_>::size(pvVar4);
  local_48 = 0.0;
  std::allocator<double>::allocator(&local_49);
  std::vector<double,_std::allocator<double>_>::vector(&local_40,__n,&local_48,&local_49);
  std::allocator<std::vector<double,_std::allocator<double>_>_>::allocator
            ((allocator<std::vector<double,_std::allocator<double>_>_> *)((long)&j + 3));
  std::
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ::vector(__return_storage_ptr__,sVar3,&local_40,
           (allocator<std::vector<double,_std::allocator<double>_>_> *)((long)&j + 3));
  std::allocator<std::vector<double,_std::allocator<double>_>_>::~allocator
            ((allocator<std::vector<double,_std::allocator<double>_>_> *)((long)&j + 3));
  std::vector<double,_std::allocator<double>_>::~vector(&local_40);
  std::allocator<double>::~allocator(&local_49);
  for (k = 0; sVar3 = std::
                      vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                      ::size(matrix1), (ulong)(long)k < sVar3; k = k + 1) {
    local_68 = 0;
    while( true ) {
      pvVar4 = std::
               vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
               ::operator[](matrix1,0);
      sVar3 = std::vector<double,_std::allocator<double>_>::size(pvVar4);
      if (sVar3 <= (ulong)(long)local_68) break;
      local_6c = 0;
      while( true ) {
        pvVar4 = std::
                 vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                 ::operator[](matrix2,0);
        sVar3 = std::vector<double,_std::allocator<double>_>::size(pvVar4);
        if (sVar3 <= (ulong)(long)local_6c) break;
        pvVar4 = std::
                 vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                 ::operator[](matrix1,(long)k);
        pvVar5 = std::vector<double,_std::allocator<double>_>::operator[](pvVar4,(long)local_68);
        dVar1 = *pvVar5;
        pvVar4 = std::
                 vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                 ::operator[](matrix2,(long)local_68);
        pvVar5 = std::vector<double,_std::allocator<double>_>::operator[](pvVar4,(long)local_6c);
        dVar2 = *pvVar5;
        pvVar4 = std::
                 vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                 ::operator[](__return_storage_ptr__,(long)k);
        pvVar5 = std::vector<double,_std::allocator<double>_>::operator[](pvVar4,(long)local_6c);
        *pvVar5 = dVar1 * dVar2 + *pvVar5;
        local_6c = local_6c + 1;
      }
      local_68 = local_68 + 1;
    }
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<std::vector<T> > dot(std::vector<std::vector<T> > matrix1, std::vector<std::vector<T> > matrix2){
    std::vector<std::vector<T> > resultMatrix(matrix1.size(), std::vector<T>(matrix2[0].size(), 0));
    for(int i=0; i<matrix1.size(); i++){
        for(int j=0; j<matrix1[0].size(); j++){
            for(int k=0; k<matrix2[0].size(); k++){
                resultMatrix[i][k] += matrix1[i][j] * matrix2[j][k];
            }
        }
    }
    return resultMatrix;
}